

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O2

int subpel_select(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int_mv *mv,MV ref_mv,
                 FULLPEL_MV start_mv,_Bool fullpel_performed_well)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  ushort uVar8;
  ushort uVar9;
  
  iVar4 = (cpi->rc).avg_frame_low_motion;
  iVar2 = (cpi->sf).rt_sf.reduce_mv_pel_precision_highmotion;
  if (iVar2 < 3) {
    if (0 < iVar2) {
      if (iVar4 - 1U < 0x27) {
        iVar4 = 0xc;
      }
      else {
        if (bsize < BLOCK_32X32) {
          lVar6 = (ulong)(iVar2 - 1) * 0xc;
          if (bsize < BLOCK_16X16) {
            piVar5 = (int *)(&DAT_00460bf8 + lVar6);
          }
          else {
            piVar5 = (int *)(&DAT_00460bf4 + lVar6);
          }
        }
        else {
          piVar5 = (int *)(&DAT_00460bf0 + (ulong)(iVar2 - 1) * 0xc);
        }
        iVar4 = *piVar5;
      }
      uVar1 = (mv->as_mv).row;
      uVar8 = -uVar1;
      if (0 < (short)uVar1) {
        uVar8 = uVar1;
      }
      if ((int)(uint)uVar8 < iVar4 * 2) {
        uVar1 = (mv->as_mv).col;
        uVar9 = -uVar1;
        if (0 < (short)uVar1) {
          uVar9 = uVar1;
        }
        if ((uint)uVar9 < (uint)(iVar4 * 2)) {
          if (iVar4 <= (int)(uint)uVar9 || iVar4 <= (int)(uint)uVar8) {
            return 2;
          }
          goto LAB_00202243;
        }
      }
      return 3;
    }
  }
  else {
    uVar3 = (uint)(bsize < BLOCK_16X32) * 2 + 4;
    if (BLOCK_32X32 < bsize) {
      uVar3 = 2;
    }
    uVar7 = 0xc;
    if (0x26 < iVar4 - 1U) {
      uVar7 = uVar3;
    }
    uVar7 = uVar7 >> ((cpi->common).height * (cpi->common).width < 0x12c01);
    uVar1 = (mv->as_mv).row;
    uVar8 = -uVar1;
    if (0 < (short)uVar1) {
      uVar8 = uVar1;
    }
    if (uVar7 <= uVar8) {
      return 2;
    }
    uVar1 = (mv->as_mv).col;
    uVar8 = -uVar1;
    if (0 < (short)uVar1) {
      uVar8 = uVar1;
    }
    if (uVar7 <= uVar8) {
      return 2;
    }
  }
LAB_00202243:
  iVar4 = (cpi->sf).rt_sf.reduce_mv_pel_precision_lowcomplex;
  if (iVar4 < 2) {
    if ((iVar4 == 1) &&
       ((ref_mv == (MV)0x0 && fullpel_performed_well) && start_mv == (FULLPEL_MV)0x0)) {
      return 2;
    }
  }
  else if (((BLOCK_16X16 < bsize) && ((x->content_state_sb).source_sad_nonrd < kLowSad)) &&
          (0x3f < (uint)x->qindex)) {
    if (x->source_variance < 500) {
      return 3;
    }
    if (x->source_variance < 5000) {
      return 2;
    }
  }
  return (uint)(cpi->sf).mv_sf.subpel_force_stop;
}

Assistant:

static inline int subpel_select(AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                                int_mv *mv, MV ref_mv, FULLPEL_MV start_mv,
                                bool fullpel_performed_well) {
  const int frame_lowmotion = cpi->rc.avg_frame_low_motion;
  const int reduce_mv_pel_precision_highmotion =
      cpi->sf.rt_sf.reduce_mv_pel_precision_highmotion;

  // Reduce MV precision for higher int MV value & frame-level motion
  if (reduce_mv_pel_precision_highmotion >= 3) {
    int mv_thresh = 4;
    const int is_low_resoln =
        (cpi->common.width * cpi->common.height <= 320 * 240);
    mv_thresh = (bsize > BLOCK_32X32) ? 2 : (bsize > BLOCK_16X16) ? 4 : 6;
    if (frame_lowmotion > 0 && frame_lowmotion < 40) mv_thresh = 12;
    mv_thresh = (is_low_resoln) ? mv_thresh >> 1 : mv_thresh;
    if (abs(mv->as_fullmv.row) >= mv_thresh ||
        abs(mv->as_fullmv.col) >= mv_thresh)
      return HALF_PEL;
  } else if (reduce_mv_pel_precision_highmotion >= 1) {
    int mv_thresh;
    const int th_vals[2][3] = { { 4, 8, 10 }, { 4, 6, 8 } };
    const int th_idx = reduce_mv_pel_precision_highmotion - 1;
    assert(th_idx >= 0 && th_idx < 2);
    if (frame_lowmotion > 0 && frame_lowmotion < 40)
      mv_thresh = 12;
    else
      mv_thresh = (bsize >= BLOCK_32X32)   ? th_vals[th_idx][0]
                  : (bsize >= BLOCK_16X16) ? th_vals[th_idx][1]
                                           : th_vals[th_idx][2];
    if (abs(mv->as_fullmv.row) >= (mv_thresh << 1) ||
        abs(mv->as_fullmv.col) >= (mv_thresh << 1))
      return FULL_PEL;
    else if (abs(mv->as_fullmv.row) >= mv_thresh ||
             abs(mv->as_fullmv.col) >= mv_thresh)
      return HALF_PEL;
  }
  // Reduce MV precision for relatively static (e.g. background), low-complex
  // large areas
  if (cpi->sf.rt_sf.reduce_mv_pel_precision_lowcomplex >= 2) {
    const int qband = x->qindex >> (QINDEX_BITS - 2);
    assert(qband < 4);
    if (x->content_state_sb.source_sad_nonrd <= kVeryLowSad &&
        bsize > BLOCK_16X16 && qband != 0) {
      if (x->source_variance < 500)
        return FULL_PEL;
      else if (x->source_variance < 5000)
        return HALF_PEL;
    }
  } else if (cpi->sf.rt_sf.reduce_mv_pel_precision_lowcomplex >= 1) {
    if (fullpel_performed_well && ref_mv.row == 0 && ref_mv.col == 0 &&
        start_mv.row == 0 && start_mv.col == 0)
      return HALF_PEL;
  }
  return cpi->sf.mv_sf.subpel_force_stop;
}